

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseDependency
          (Node *this,uint64_t depId,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo,bool ignoreIfNotFound)

{
  Impl *this_00;
  Node *this_01;
  Fault local_58;
  Fault f;
  Node *node;
  bool ignoreIfNotFound_local;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  uint64_t uStack_18;
  uint eagerness_local;
  uint64_t depId_local;
  Node *this_local;
  
  uStack_18 = depId;
  depId_local = (uint64_t)this;
  this_00 = CompiledModule::getCompiler(this->module);
  f.exception = (Exception *)Compiler::Impl::findNode(this_00,uStack_18);
  this_01 = kj::_::readMaybe<capnp::compiler::Compiler::Node>
                      ((Maybe<capnp::compiler::Compiler::Node_&> *)&f);
  if (this_01 == (Node *)0x0) {
    if (!ignoreIfNotFound) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],unsigned_long&>
                (&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                 ,0x343,FAILED,(char *)0x0,"\"Dependency ID not present in compiler?\", depId",
                 (char (*) [39])"Dependency ID not present in compiler?",&stack0xffffffffffffffe8);
      kj::_::Debug::Fault::fatal(&local_58);
    }
  }
  else {
    traverse(this_01,eagerness,seen,finalLoader,sourceInfo);
  }
  return;
}

Assistant:

void Compiler::Node::traverseDependency(uint64_t depId, uint eagerness,
                                        std::unordered_map<Node*, uint>& seen,
                                        const SchemaLoader& finalLoader,
                                        kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo,
                                        bool ignoreIfNotFound) {
  KJ_IF_MAYBE(node, module->getCompiler().findNode(depId)) {
    node->traverse(eagerness, seen, finalLoader, sourceInfo);
  } else if (!ignoreIfNotFound) {
    KJ_FAIL_ASSERT("Dependency ID not present in compiler?", depId);
  }
}